

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dae.cpp
# Opt level: O1

Version __thiscall opencollada::Dae::getVersion(Dae *this)

{
  int iVar1;
  Version VVar2;
  string root_namespace;
  string local_30;
  
  XmlDoc::getRootNamespace_abi_cxx11_(&local_30,&this->super_XmlDoc);
  if (local_30._M_string_length == _DAT_0015cbd8) {
    VVar2 = COLLADA14;
    if (local_30._M_string_length == 0) goto LAB_0013cf72;
    iVar1 = bcmp(local_30._M_dataplus._M_p,mColladaNamespace141_abi_cxx11_,local_30._M_string_length
                );
    if (iVar1 == 0) goto LAB_0013cf72;
  }
  VVar2 = Unknown;
  if (local_30._M_string_length == DAT_0015cce8) {
    if (local_30._M_string_length == 0) {
      VVar2 = COLLADA15;
    }
    else {
      iVar1 = bcmp(local_30._M_dataplus._M_p,mColladaNamespace15_abi_cxx11_,
                   local_30._M_string_length);
      VVar2 = (uint)(iVar1 == 0) * 2;
    }
  }
LAB_0013cf72:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return VVar2;
}

Assistant:

Dae::Version Dae::getVersion() const
	{
		string root_namespace = getRootNamespace();
		if (root_namespace == Dae::GetColladaNamespace141())
			return Version::COLLADA14;
		else if (root_namespace == Dae::GetColladaNamespace15())
			return Version::COLLADA15;
		return Version::Unknown;
	}